

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  cmMakefile *pcVar1;
  byte bVar2;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmLocalGenerator_cxx:269:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmLocalGenerator_cxx:269:5)>
  __comp_00;
  byte bVar3;
  pointer __last;
  bool bVar4;
  string *psVar5;
  cmValue cVar6;
  cmValue cVar7;
  cmValue cVar8;
  cmValue cVar9;
  cmValue cVar10;
  ostream *poVar11;
  cmValue cVar12;
  pointer pbVar13;
  string_view source;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  string_view str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string flags;
  string *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string sep;
  string local_1c8;
  ostringstream includeFlags;
  long local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  
  if (lang->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&includeFlags);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&includes,includeDirs);
    __last = includes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar13 = includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sep._M_dataplus._M_p = (pointer)target;
    if (target != (cmGeneratorTarget *)0x0) {
      emitted._M_t._M_impl._0_8_ = &sep;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = config;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)lang;
      if (includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&includeFlags,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )includes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (((long)includes.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)includes.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1) / 2);
        if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          __comp_00._M_comp.target = (cmGeneratorTarget **)emitted._M_t._M_impl._0_8_;
          __comp_00._M_comp.lang =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar13,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,__comp_00);
        }
        else {
          __comp._M_comp.config =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          __comp._M_comp.target = (cmGeneratorTarget **)emitted._M_t._M_impl._0_8_;
          __comp._M_comp.lang =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar13,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,local_198,local_1a0,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&includeFlags);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeFlags);
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[20],std::__cxx11::string_const&>
              ((string *)&emitted,(char (*) [20])"CMAKE_INCLUDE_FLAG_",lang);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"CMAKE_QUOTE_INCLUDE_PATHS",(allocator<char> *)&sep);
    cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sep," ",(allocator<char> *)&emitted);
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[24],std::__cxx11::string_const&>
              ((string *)&emitted,(char (*) [24])"CMAKE_INCLUDE_FLAG_SEP_",lang);
    cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    if (cVar7.Value == (string *)0x0) {
      pcVar1 = this->Makefile;
      cmStrCat<char_const(&)[27],std::__cxx11::string_const&>
                ((string *)&emitted,(char (*) [27])0x6c5338,lang);
      local_250 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
      std::__cxx11::string::~string((string *)&emitted);
      pcVar1 = this->Makefile;
      cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[9]>
                ((string *)&emitted,(char (*) [28])"_CMAKE_INCLUDE_SYSTEM_FLAG_",lang,
                 (char (*) [9])0x6f606d);
      cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
      std::__cxx11::string::~string((string *)&emitted);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&sep);
      cVar8.Value = (string *)0x0;
      local_250 = (string *)0x0;
    }
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[23]>
              ((string *)&emitted,(char (*) [7])0x6cf18b,lang,(char (*) [23])0x6c535a);
    cVar9 = cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[30]>
              ((string *)&emitted,(char (*) [7])0x6cf18b,lang,
               (char (*) [30])"_SYSTEM_FRAMEWORK_SEARCH_FLAG");
    cVar10 = cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar3 = 0;
    bVar2 = 0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pbVar13 = includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar13 !=
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
      if ((cVar9.Value == (string *)0x0) || ((cVar9.Value)->_M_string_length == 0)) {
LAB_0021ccc0:
        if (!(bool)(cVar7.Value != (string *)0x0 & bVar2)) {
          if (local_250 != (string *)0x0 && target != (cmGeneratorTarget *)0x0) {
            bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory(target,pbVar13,config,lang);
            if (bVar4) {
              bVar3 = 1;
              std::operator<<((ostream *)&includeFlags,(string *)local_250);
              goto LAB_0021cd21;
            }
          }
          std::operator<<((ostream *)&includeFlags,(string *)psVar5);
        }
LAB_0021cd21:
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0x13])
                  (&flags,this,pbVar13,(ulong)((uint)forResponseFile * 2));
        if (((cVar6.Value != (string *)0x0) && (flags._M_string_length != 0)) &&
           (*flags._M_dataplus._M_p != '\"')) {
          std::operator<<((ostream *)&includeFlags,"\"");
        }
        std::operator<<((ostream *)&includeFlags,(string *)&flags);
        if (((cVar6.Value != (string *)0x0) && (flags._M_string_length != 0)) &&
           (*flags._M_dataplus._M_p != '\"')) {
          std::operator<<((ostream *)&includeFlags,"\"");
        }
        std::operator<<((ostream *)&includeFlags,(string *)&sep);
        std::__cxx11::string::~string((string *)&flags);
        bVar2 = 1;
      }
      else {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&flags,"APPLE",(allocator<char> *)&local_1c8);
        bVar4 = cmMakefile::IsOn(pcVar1,&flags);
        if (!bVar4) {
          std::__cxx11::string::~string((string *)&flags);
          goto LAB_0021ccc0;
        }
        bVar4 = cmSystemTools::IsPathToFramework(pbVar13);
        std::__cxx11::string::~string((string *)&flags);
        if (!bVar4) goto LAB_0021ccc0;
        cmsys::SystemTools::GetFilenamePath(&flags,pbVar13);
        pVar14 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&emitted,&flags);
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          cVar12 = cVar9;
          if (cVar10.Value != (string *)0x0 && target != (cmGeneratorTarget *)0x0) {
            bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory(target,&flags,config,lang);
            if (bVar4) {
              cVar12 = cVar10;
            }
          }
          std::operator<<((ostream *)&includeFlags,(string *)cVar12.Value);
          source._M_str = flags._M_dataplus._M_p;
          source._M_len = flags._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_1c8,&this->super_cmOutputConverter,source,(uint)forResponseFile * 2,
                     false);
          poVar11 = std::operator<<((ostream *)&includeFlags,(string *)&local_1c8);
          std::operator<<(poVar11," ");
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&flags);
      }
    }
    if ((bool)(bVar3 & cVar8.Value != (string *)0x0)) {
      std::operator<<((ostream *)&includeFlags,(string *)cVar8.Value);
    }
    std::__cxx11::stringbuf::str();
    if (((*sep._M_dataplus._M_p != ' ') && (flags._M_string_length != 0)) &&
       (flags._M_dataplus._M_p[flags._M_string_length - 1] == *sep._M_dataplus._M_p)) {
      flags._M_dataplus._M_p[flags._M_string_length - 1] = ' ';
    }
    str._M_str = flags._M_dataplus._M_p;
    str._M_len = flags._M_string_length;
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,str);
    std::__cxx11::string::~string((string *)&flags);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&emitted._M_t);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeFlags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = *incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir = cmSystemTools::GetFilenamePath(i);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(frameworkDir, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}